

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void duckdb::MergeValidityLoop
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,row_t *ids,idx_t count,SelectionVector *sel)

{
  UpdateInfo *__dest;
  void *__dest_00;
  uint uVar1;
  uint uVar2;
  sel_t sVar3;
  row_t *prVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  UpdateInfo *count_00;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  idx_t id;
  void *__dest_01;
  ulong uVar16;
  UpdateInfo *pUVar17;
  long lVar18;
  bool result_values [2048];
  sel_t result_ids [2048];
  idx_t local_28b0;
  UpdateInfo *local_28a8;
  row_t *local_28a0;
  long local_2898;
  long local_2890;
  SelectionVector *local_2888;
  TemplatedValidityMask<unsigned_long> *local_2880;
  void *local_2878;
  ulong local_2870;
  ValidityMask *local_2868;
  undefined1 local_2860 [40];
  UpdateSegment local_2838 [6];
  sel_t local_2038 [2050];
  
  local_28a0 = ids;
  FlatVector::VerifyFlatVector(base_data);
  local_2888 = update->sel;
  local_2868 = &update->validity;
  lVar7 = base_info->vector_index * 0x800 + base_info->segment->column_data->start;
  local_2880 = &(base_data->validity).super_TemplatedValidityMask<unsigned_long>;
  __dest = base_info + 1;
  __dest_00 = (void *)((long)&base_info[1].segment + (ulong)base_info->max * 4);
  local_28a8 = update_info + 1;
  __dest_01 = (void *)((long)&update_info[1].segment + (ulong)update_info->max * 4);
  local_2890 = (ulong)update_info->max << 2;
  lVar10 = 0;
  uVar14 = 0;
  uVar11 = 0;
  local_2878 = __dest_01;
  local_2870 = count;
  for (uVar16 = 0; uVar12 = local_2870, prVar4 = local_28a0, uVar16 != local_2870;
      uVar16 = uVar16 + 1) {
    uVar12 = uVar16;
    if (sel->sel_vector != (sel_t *)0x0) {
      uVar12 = (ulong)sel->sel_vector[uVar16];
    }
    uVar12 = local_28a0[uVar12] - lVar7;
    uVar1 = update_info->N;
    for (lVar18 = 0; lVar9 = lVar10, uVar14 + lVar18 < (ulong)uVar1; lVar18 = lVar18 + 1) {
      uVar2 = *(uint *)((long)&local_28a8->segment + lVar18 * 4 + uVar14 * 4);
      if (uVar12 <= uVar2) {
        if (uVar12 == uVar2) {
          *(undefined1 *)((long)&local_2838[0].column_data + lVar18 + lVar10) =
               *(undefined1 *)((long)__dest_01 + uVar14 + lVar18);
          local_2038[lVar10 + lVar18] = uVar2;
          uVar8 = uVar11;
          uVar14 = uVar14 + lVar18 + 1;
          goto LAB_01aaded6;
        }
        break;
      }
      *(undefined1 *)((long)&local_2838[0].column_data + lVar18 + lVar10) =
           *(undefined1 *)((long)__dest_01 + lVar18 + uVar14);
      local_2038[lVar10 + lVar18] = uVar2;
    }
    uVar6 = (ulong)base_info->N;
    uVar8 = uVar6;
    if (uVar6 < uVar11) {
      uVar8 = uVar11;
    }
    for (; uVar11 < uVar6; uVar11 = uVar11 + 1) {
      uVar15 = (ulong)*(uint *)((long)&__dest->segment + uVar11 * 4);
      if (uVar12 <= uVar15) {
        uVar8 = uVar11;
        if (uVar12 == uVar15) {
          *(undefined1 *)((long)&local_2838[0].column_data + lVar18 + lVar10) =
               *(undefined1 *)((long)__dest_00 + uVar11);
          goto LAB_01aadecc;
        }
        break;
      }
    }
    local_2898 = lVar10;
    bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid(local_2880,uVar12);
    *(bool *)((long)&local_2838[0].column_data + lVar18 + lVar10) = bVar5;
    lVar9 = local_2898;
    __dest_01 = local_2878;
LAB_01aadecc:
    local_2038[lVar10 + lVar18] = (sel_t)uVar12;
    uVar14 = uVar14 + lVar18;
LAB_01aaded6:
    lVar10 = lVar9 + lVar18 + 1;
    uVar11 = uVar8;
  }
  uVar1 = update_info->N;
  sVar13 = lVar10 * 4;
  for (lVar18 = 0; uVar14 + lVar18 < (ulong)uVar1; lVar18 = lVar18 + 1) {
    *(undefined1 *)((long)&local_2838[0].column_data + lVar18 + lVar10) =
         *(undefined1 *)((long)&update_info[1].segment + lVar18 + uVar14 + local_2890);
    local_2038[lVar10 + lVar18] =
         *(sel_t *)((long)&update_info[1].segment + lVar18 * 4 + uVar14 * 4);
    sVar13 = sVar13 + 4;
  }
  update_info->N = (sel_t)(lVar10 + lVar18);
  switchD_016b45db::default(__dest_01,local_2838,lVar10 + lVar18);
  switchD_016b45db::default(local_28a8,(sel_t (*) [2048])local_2038,sVar13);
  local_2860._8_8_ = &local_28b0;
  local_28b0 = 0;
  count_00 = (UpdateInfo *)local_2860;
  local_2860._16_8_ = &local_2868;
  local_2860._24_8_ = local_2888;
  uVar1 = base_info->N;
  uVar14 = 0;
  uVar11 = 0;
  pUVar17 = __dest;
  local_2860._0_8_ = local_2838;
  local_2860._32_8_ = (sel_t (*) [2048])local_2038;
  do {
    while( true ) {
      if ((uVar12 <= uVar11) || (count_00 = __dest, uVar1 <= uVar14)) {
        for (; uVar11 < uVar12; uVar11 = uVar11 + 1) {
          uVar16 = uVar11;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)sel->sel_vector[uVar11];
          }
          MergeUpdateLoopInternal<bool,_duckdb::ValidityMask,_duckdb::ExtractValidityEntry>::
          anon_class_40_5_fa23cdf1::operator()
                    ((anon_class_40_5_fa23cdf1 *)local_2860,prVar4[uVar16] - lVar7,uVar16,
                     (idx_t)count_00);
        }
        sVar13 = local_28b0 * 4;
        for (lVar7 = 0; lVar7 + uVar14 < (ulong)uVar1; lVar7 = lVar7 + 1) {
          sVar3 = *(sel_t *)&pUVar17->segment;
          *(undefined1 *)((long)&local_2838[0].column_data + lVar7 + local_28b0) =
               *(undefined1 *)((long)__dest_00 + lVar7 + uVar14);
          local_2038[local_28b0 + lVar7] = sVar3;
          sVar13 = sVar13 + 4;
          pUVar17 = (UpdateInfo *)((long)&pUVar17->segment + 4);
        }
        base_info->N = (sel_t)(local_28b0 + lVar7);
        switchD_016b45db::default(__dest_00,local_2838,local_28b0 + lVar7);
        switchD_016b45db::default(__dest,local_2038,sVar13);
        return;
      }
      uVar16 = uVar11;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar16 = (ulong)sel->sel_vector[uVar11];
      }
      id = prVar4[uVar16] - lVar7;
      uVar2 = *(uint *)((long)&__dest->segment + uVar14 * 4);
      if (id != uVar2) break;
      MergeUpdateLoopInternal<bool,_duckdb::ValidityMask,_duckdb::ExtractValidityEntry>::
      anon_class_40_5_fa23cdf1::operator()
                ((anon_class_40_5_fa23cdf1 *)local_2860,id,uVar16,(idx_t)__dest);
      uVar11 = uVar11 + 1;
LAB_01aae048:
      uVar14 = uVar14 + 1;
      pUVar17 = (UpdateInfo *)((long)&pUVar17->segment + 4);
    }
    if (uVar2 <= id) {
      count_00 = (UpdateInfo *)
                 CONCAT71((int7)((ulong)__dest_00 >> 8),*(undefined1 *)((long)__dest_00 + uVar14));
      *(undefined1 *)((long)&local_2838[0].column_data + local_28b0) =
           *(undefined1 *)((long)__dest_00 + uVar14);
      local_2038[local_28b0] = uVar2;
      local_28b0 = local_28b0 + 1;
      goto LAB_01aae048;
    }
    MergeUpdateLoopInternal<bool,_duckdb::ValidityMask,_duckdb::ExtractValidityEntry>::
    anon_class_40_5_fa23cdf1::operator()
              ((anon_class_40_5_fa23cdf1 *)local_2860,id,uVar16,(idx_t)__dest);
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

static void MergeValidityLoop(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                              UnifiedVectorFormat &update, row_t *ids, idx_t count, const SelectionVector &sel) {
	auto &base_validity = FlatVector::Validity(base_data);
	auto &update_validity = update.validity;
	MergeUpdateLoopInternal<bool, ValidityMask, ExtractValidityEntry>(base_info, &base_validity, update_info,
	                                                                  *update.sel, &update_validity, ids, count, sel);
}